

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderDNA.h
# Opt level: O2

World * __thiscall
Assimp::Blender::Structure::_allocate<Assimp::Blender::World>
          (Structure *this,shared_ptr<Assimp::Blender::World> *out,size_t *s)

{
  World *__p;
  __shared_ptr<Assimp::Blender::World,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  __p = (World *)operator_new(0x428);
  memset(__p,0,0x428);
  (__p->super_ElemBase)._vptr_ElemBase = (_func_int **)&PTR__World_00720698;
  (__p->id).super_ElemBase._vptr_ElemBase = (_func_int **)&PTR__ElemBase_0071fdf0;
  ::std::__shared_ptr<Assimp::Blender::World,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<Assimp::Blender::World,void>
            ((__shared_ptr<Assimp::Blender::World,(__gnu_cxx::_Lock_policy)2> *)&local_30,__p);
  ::std::__shared_ptr<Assimp::Blender::World,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&out->super___shared_ptr<Assimp::Blender::World,_(__gnu_cxx::_Lock_policy)2>,&local_30)
  ;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  *s = 1;
  return (out->super___shared_ptr<Assimp::Blender::World,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
}

Assistant:

T* _allocate(std::shared_ptr<T>& out, size_t& s) const {
        out = std::shared_ptr<T>(new T());
        s = 1;
        return out.get();
    }